

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void glist_doread(_glist *x,t_symbol *filename,t_symbol *format,int clearme)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  _glist *x_00;
  _glist *x_01;
  uint crflag;
  
  x_00 = (_glist *)binbuf_new();
  x_01 = glist_getcanvas(x_00);
  iVar3 = glist_isvisible(x_01);
  pbVar2 = (byte *)format->s_name;
  bVar1 = *pbVar2;
  crflag = (uint)bVar1;
  if (bVar1 != 0) {
    if (((bVar1 == 99) && (pbVar2[1] == 0x72)) && (pbVar2[2] == 0)) {
      crflag = 1;
    }
    else {
      crflag = 0;
      pd_error((void *)0x0,"qlist_read: unknown flag: %s");
    }
  }
  iVar4 = binbuf_read_via_canvas((_binbuf *)x_00,filename->s_name,x_01,crflag);
  if (iVar4 == 0) {
    if (iVar3 != 0) {
      canvas_vis(x_01,0.0);
    }
    if (clearme != 0) {
      glist_clear(x);
    }
    glist_readfrombinbuf(x,(_binbuf *)x_00,filename->s_name,0);
    if (iVar3 != 0) {
      canvas_vis(x_01,1.0);
    }
  }
  else {
    pd_error(x,"read failed");
  }
  binbuf_free((_binbuf *)x_00);
  return;
}

Assistant:

static void glist_doread(t_glist *x, t_symbol *filename, t_symbol *format,
    int clearme)
{
    t_binbuf *b = binbuf_new();
    t_canvas *canvas = glist_getcanvas(x);
    int wasvis = glist_isvisible(canvas);
    int cr = 0;

    if (!strcmp(format->s_name, "cr"))
        cr = 1;
    else if (*format->s_name)
        pd_error(0, "qlist_read: unknown flag: %s", format->s_name);

    if (binbuf_read_via_canvas(b, filename->s_name, canvas, cr))
    {
        pd_error(x, "read failed");
        binbuf_free(b);
        return;
    }
    if (wasvis)
        canvas_vis(canvas, 0);
    if (clearme)
        glist_clear(x);
    glist_readfrombinbuf(x, b, filename->s_name, 0);
    if (wasvis)
        canvas_vis(canvas, 1);
    binbuf_free(b);
}